

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

cbtVector3 PlaneLineIntersection(cbtPlane *plane,cbtVector3 *p0,cbtVector3 *p1)

{
  undefined1 auVar1 [16];
  cbtScalar cVar2;
  float fVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  cbtVector3 cVar9;
  float local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  cbtVector3 local_20;
  
  auVar8 = in_ZMM1._8_56_;
  auVar5 = in_ZMM0._8_56_;
  cVar9 = operator-(p1,p0);
  auVar7._0_8_ = cVar9.m_floats._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = cVar9.m_floats._0_8_;
  auVar4._8_56_ = auVar5;
  auVar6 = vmovshdup_avx(auVar4._0_16_);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * (plane->normal).m_floats[1])),auVar4._0_16_
                           ,ZEXT416((uint)(plane->normal).m_floats[0]));
  auVar6 = vfmadd231ss_fma(auVar6,auVar7._0_16_,ZEXT416((uint)(plane->normal).m_floats[2]));
  fVar3 = plane->dist;
  cVar2 = cbtVector3::dot(&plane->normal,p0);
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vxorps_avx512vl(ZEXT416((uint)(cVar2 + fVar3)),auVar1);
  fVar3 = auVar1._0_4_ / auVar6._0_4_;
  local_38 = cVar9.m_floats[0];
  fStack_34 = cVar9.m_floats[1];
  fStack_30 = auVar5._0_4_;
  fStack_2c = auVar5._4_4_;
  auVar6._0_4_ = fVar3 * local_38;
  auVar6._4_4_ = fVar3 * fStack_34;
  auVar6._8_4_ = fVar3 * fStack_30;
  auVar6._12_4_ = fVar3 * fStack_2c;
  local_48 = cVar9.m_floats[2];
  local_20.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,ZEXT416((uint)(fVar3 * local_48)),0x28);
  cVar9 = operator+(p0,&local_20);
  return (cbtVector3)cVar9.m_floats;
}

Assistant:

cbtVector3 PlaneLineIntersection(const cbtPlane &plane, const cbtVector3 &p0, const cbtVector3 &p1)
{
	// returns the point where the line p0-p1 intersects the plane n&d
	cbtVector3 dif;
	dif = p1 - p0;
	cbtScalar dn = cbtDot(plane.normal, dif);
	cbtScalar t = -(plane.dist + cbtDot(plane.normal, p0)) / dn;
	return p0 + (dif * t);
}